

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O2

void __thiscall cmInstallExportGenerator::ComputeTempDir(cmInstallExportGenerator *this)

{
  string *input;
  string *psVar1;
  ulong uVar2;
  string dest;
  string local_38;
  
  cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
  psVar1 = &this->TempDir;
  std::__cxx11::string::assign((char *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  if ((this->super_cmInstallGenerator).Destination._M_string_length != 0) {
    input = &(this->super_cmInstallGenerator).Destination;
    std::__cxx11::string::append((char *)psVar1);
    uVar2 = (this->TempDir)._M_string_length;
    if ((uVar2 < 1000) &&
       ((this->super_cmInstallGenerator).Destination._M_string_length <= 1000 - uVar2)) {
      std::__cxx11::string::string((string *)&local_38,(string *)input);
      if (*local_38._M_dataplus._M_p == '/') {
        *local_38._M_dataplus._M_p = '_';
      }
      cmsys::SystemTools::ReplaceString(&local_38,":","_");
      cmsys::SystemTools::ReplaceString(&local_38,"../","__/");
      cmsys::SystemTools::ReplaceString(&local_38," ","_");
      std::__cxx11::string::append((string *)psVar1);
    }
    else {
      cmSystemTools::ComputeStringMD5(&local_38,input);
      std::__cxx11::string::append((string *)psVar1);
    }
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void cmInstallExportGenerator::ComputeTempDir()
{
  // Choose a temporary directory in which to generate the import
  // files to be installed.
  this->TempDir = this->Makefile->GetCurrentBinaryDirectory();
  this->TempDir += cmake::GetCMakeFilesDirectory();
  this->TempDir += "/Export";
  if(this->Destination.empty())
    {
    return;
    }
  else
    {
    this->TempDir += "/";
    }

  // Enforce a maximum length.
  bool useMD5 = false;
#if defined(_WIN32) || defined(__CYGWIN__)
  std::string::size_type const max_total_len = 250;
#else
  std::string::size_type const max_total_len = 1000;
#endif
  if(this->TempDir.size() < max_total_len)
    {
    // Keep the total path length below the limit.
    std::string::size_type max_len = max_total_len - this->TempDir.size();
    if(this->Destination.size() > max_len)
      {
      useMD5 = true;
      }
    }
  else
    {
    useMD5 = true;
    }
  if(useMD5)
    {
    // Replace the destination path with a hash to keep it short.
    this->TempDir +=
      cmSystemTools::ComputeStringMD5(this->Destination);
    }
  else
    {
    std::string dest = this->Destination;
    // Avoid unix full paths.
    if(dest[0] == '/')
      {
      dest[0] = '_';
      }
    // Avoid windows full paths by removing colons.
    cmSystemTools::ReplaceString(dest, ":", "_");
    // Avoid relative paths that go up the tree.
    cmSystemTools::ReplaceString(dest, "../", "__/");
    // Avoid spaces.
    cmSystemTools::ReplaceString(dest, " ", "_");
    this->TempDir += dest;
    }
}